

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O3

void __thiscall spvtools::opt::LoopUtils::MakeLoopClosedSSA(LoopUtils *this)

{
  IRContext *pIVar1;
  CFG *this_00;
  BasicBlock *pBVar2;
  Instruction *pIVar3;
  _Hash_node_base *p_Var4;
  Function *function;
  float fVar5;
  uint32_t uVar6;
  IRContext *this_01;
  _Hash_node_base *p_Var7;
  __node_gen_type __node_gen;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  exit_bb;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  merging_bb_id;
  LCSSARewriter lcssa_rewriter;
  BasicBlock *local_120;
  Function *local_118;
  DominatorAnalysis *local_110;
  undefined1 local_108 [32];
  float local_e8;
  Instruction *local_e0;
  __node_base_ptr p_Stack_d8;
  IRContext *local_d0;
  undefined1 local_c8 [48];
  pointer pIStack_98;
  undefined1 local_90 [56];
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  CreateLoopDedicatedExits(this);
  pIVar1 = this->context_;
  local_118 = this->loop_->loop_header_->function_;
  this_01 = pIVar1;
  if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar1);
    this_01 = this->context_;
  }
  this_00 = (pIVar1->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  local_110 = IRContext::GetDominatorAnalysis(this_01,local_118);
  local_108._0_8_ = &p_Stack_d8;
  local_108._8_8_ =
       (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        )0x1;
  local_108._16_8_ = (_Hash_node_base *)0x0;
  local_108._24_8_ = (_func_int **)0x0;
  local_e8 = 1.0;
  local_e0 = (Instruction *)0x0;
  p_Stack_d8 = (__node_base_ptr)0x0;
  local_90._0_8_ = local_90 + 0x30;
  local_90._8_4_ = 1;
  local_90._12_4_ = 0;
  local_90._16_8_ = (_Hash_node_base *)0x0;
  local_90._24_8_ =
       (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
        *)0x0;
  local_90._32_4_ = 1.0;
  local_90._40_8_ = (__buckets_ptr)0x0;
  local_90._48_8_ = (__node_base_ptr)0x0;
  Loop::GetExitBlocks(this->loop_,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)local_90);
  if ((_Hash_node_base *)local_90._16_8_ != (_Hash_node_base *)0x0) {
    p_Var7 = (_Hash_node_base *)local_90._16_8_;
    do {
      local_120 = CFG::block(this_00,*(uint32_t *)&p_Var7[1]._M_nxt);
      local_c8._0_8_ =
           (_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            *)local_108;
      std::
      _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::BasicBlock*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
                ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_108,&local_120,local_c8);
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_90);
  pIVar1 = this->context_;
  pBVar2 = this->loop_->loop_merge_;
  local_90._0_8_ = pIVar1;
  if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar1);
  }
  function = local_118;
  local_90._8_8_ =
       (pIVar1->cfg_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
       super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  local_90._16_8_ = local_110;
  local_90._24_8_ = local_108;
  fVar5 = 0.0;
  if ((pBVar2 != (BasicBlock *)0x0) &&
     (pIVar3 = (pBVar2->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl, fVar5 = 0.0
     , pIVar3->has_result_id_ == true)) {
    fVar5 = (float)Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
  }
  local_90._40_8_ = &p_Stack_38;
  local_90._48_8_ = (__node_base_ptr)0x1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  sStack_50 = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_90._32_4_ = fVar5;
  anon_unknown_15::MakeSetClosedSSA
            (this->context_,function,&this->loop_->loop_basic_blocks_,
             (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
              *)local_108,(LCSSARewriter *)local_90);
  if (this->loop_->loop_merge_ != (BasicBlock *)0x0) {
    local_c8._0_8_ = &pIStack_98;
    local_c8._8_8_ = 1;
    local_c8._16_8_ = (pointer)0x0;
    local_c8._24_8_ = (pointer)0x0;
    local_c8._32_4_ = 1.0;
    local_c8._40_8_ = (pointer)0x0;
    pIStack_98 = (pointer)0x0;
    Loop::GetMergingBlocks
              (this->loop_,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_c8);
    pIVar3 = (this->loop_->loop_merge_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar6 = 0;
    if (pIVar3->has_result_id_ == true) {
      uVar6 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
    }
    local_120 = (BasicBlock *)CONCAT44(local_120._4_4_,uVar6);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_c8);
    p_Var7 = (_Hash_node_base *)local_108._16_8_;
    while (p_Var7 != (_Hash_node_base *)0x0) {
      p_Var4 = p_Var7->_M_nxt;
      operator_delete(p_Var7,0x10);
      p_Var7 = p_Var4;
    }
    memset((void *)local_108._0_8_,0,local_108._8_8_ << 3);
    local_108._16_8_ = (_Hash_node_base *)0x0;
    local_108._24_8_ = (_func_int **)0x0;
    local_d0 = (IRContext *)this->loop_->loop_merge_;
    local_120 = (BasicBlock *)local_108;
    std::
    _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<spvtools::opt::BasicBlock*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
              ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_108);
    anon_unknown_15::MakeSetClosedSSA
              (this->context_,function,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_c8,
               (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                *)local_108,(LCSSARewriter *)local_90);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_c8);
  }
  IRContext::InvalidateAnalysesExceptFor
            (this->context_,kAnalysisLoopAnalysis|kAnalysisDominatorAnalysis|kAnalysisCFG);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_90 + 0x28));
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_108);
  return;
}

Assistant:

void LoopUtils::MakeLoopClosedSSA() {
  CreateLoopDedicatedExits();

  Function* function = loop_->GetHeaderBlock()->GetParent();
  CFG& cfg = *context_->cfg();
  DominatorTree& dom_tree =
      context_->GetDominatorAnalysis(function)->GetDomTree();

  std::unordered_set<BasicBlock*> exit_bb;
  {
    std::unordered_set<uint32_t> exit_bb_id;
    loop_->GetExitBlocks(&exit_bb_id);
    for (uint32_t bb_id : exit_bb_id) {
      exit_bb.insert(cfg.block(bb_id));
    }
  }

  LCSSARewriter lcssa_rewriter(context_, dom_tree, exit_bb,
                               loop_->GetMergeBlock());
  MakeSetClosedSSA(context_, function, loop_->GetBlocks(), exit_bb,
                   &lcssa_rewriter);

  // Make sure all defs post-dominated by the merge block have their last use no
  // further than the merge block.
  if (loop_->GetMergeBlock()) {
    std::unordered_set<uint32_t> merging_bb_id;
    loop_->GetMergingBlocks(&merging_bb_id);
    merging_bb_id.erase(loop_->GetMergeBlock()->id());
    // Reset the exit set, now only the merge block is the exit.
    exit_bb.clear();
    exit_bb.insert(loop_->GetMergeBlock());
    // LCSSARewriter is reusable here only because it forces the creation of a
    // phi instruction in the merge block.
    MakeSetClosedSSA(context_, function, merging_bb_id, exit_bb,
                     &lcssa_rewriter);
  }

  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisCFG |
      IRContext::Analysis::kAnalysisDominatorAnalysis |
      IRContext::Analysis::kAnalysisLoopAnalysis);
}